

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
SquareRootUnscentedKalmanFilter_computeCovarianceSquareRootFromSigmaPoints_Test::
~SquareRootUnscentedKalmanFilter_computeCovarianceSquareRootFromSigmaPoints_Test
          (SquareRootUnscentedKalmanFilter_computeCovarianceSquareRootFromSigmaPoints_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, computeCovarianceSquareRootFromSigmaPoints) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Compute standard (non-square root) covariance from regular UKF
    // and test equality with square-root solution
    
    Cholesky<Matrix<T, 4, 4>> Rsqrt;
    Matrix<T,4,4> _Rsqrt;
    _Rsqrt <<   1, 0, 0, 0,
                0, 2, 0, 0,
                0, 0, 3, 0,
                0, 0, 0, 4;
    
    Rsqrt.setL(_Rsqrt);
    
    Vector<T,4> mean;
    mean << 2, 3, 4, 5;
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Matrix<T, 4, 7> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2,
        3,  5,  4,  4,  1,  2,  2,
        3,  4,  5,  2,  0,  4,  3;
    
    Cholesky<Matrix<T,4,4>> S;
    
    ASSERT_TRUE(ukf.computeCovarianceSquareRootFromSigmaPoints(mean, sigmaPoints, Rsqrt, S));
    
    // Compute reference P
    Matrix<T,4,4> P = Matrix<T,4,4>::Zero();
    for( int i = 0; i <= 2*3; ++i )
    {
        Vector<T,4> vec = sigmaPoints.col(i) - mean;
        P += ukf.sigmaWeights_c[i] * vec * vec.transpose();
    }
    P += Rsqrt.reconstructedMatrix();
    
    // Compute squared S
    Matrix<T,4,4> Ssquared = S.reconstructedMatrix().eval();
    
    ASSERT_MATRIX_NEAR(P, Ssquared, 3.5e-5);
}